

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::runCliqueMerging
          (HighsCliqueTable *this,HighsDomain *globaldomain,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique,
          bool equation)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  double *pdVar1;
  double dVar2;
  CliqueVar CVar3;
  int iVar4;
  bool bVar5;
  HighsInt i;
  HighsInt HVar6;
  pointer pCVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  long lVar9;
  const_iterator __last;
  int iVar10;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __first;
  pointer pCVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  HighsInt i_1;
  CliqueVar *pCVar16;
  CliqueVar unaff_R13D;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  __it;
  long lVar17;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  anon_class_24_3_c8bba91f addCands;
  anon_class_8_1_9cafd1bc local_90;
  ulong local_88;
  undefined4 local_7c;
  long local_78;
  HighsDomain *local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  HighsCliqueTable *local_48;
  HighsDomain *local_40;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *local_38;
  
  local_7c = (undefined4)CONCAT71(in_register_00000009,equation);
  this_00 = &this->iscandidate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->invertedHashList).
                           super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_68,
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->invertedHashList).
                   super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pCVar11 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_88 = (long)pCVar7 - (long)pCVar11;
  iVar10 = (int)((long)local_88 >> 2);
  uVar8 = (long)local_88 >> 2 & 0xffffffff;
  iVar12 = 0x7fffffff;
  for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
    uVar15 = (uint)(this->cliqueentries).
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14] & 0x7fffffff;
    dVar2 = (globaldomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15];
    pdVar1 = (globaldomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + uVar15;
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      CVar3 = pCVar11[uVar14];
      iVar4 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))];
      if (iVar4 < iVar12) {
        iVar12 = iVar4;
        unaff_R13D = CVar3;
      }
    }
  }
  if (iVar12 == 0x7fffffff) {
    if (pCVar7 != pCVar11) {
      (clique->
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>)
      ._M_impl.super__Vector_impl_data._M_finish = pCVar11;
    }
    goto LAB_0027a215;
  }
  for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
    CVar3 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar14];
    (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))] = '\x01';
  }
  local_90.addCands = (anon_class_24_3_c8bba91f *)&stack0xffffffffffffffb8;
  uVar15 = (int)unaff_R13D << 1 | (uint)((int)unaff_R13D < 0);
  local_48 = this;
  local_40 = globaldomain;
  local_38 = clique;
  HighsHashTree<int,_int>::
  for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2001:7)_&,_0>
            ((NodePtr)(this->invertedHashList).
                      super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar15].root.ptrAndType,
             &local_90);
  local_90.addCands = (anon_class_24_3_c8bba91f *)&stack0xffffffffffffffb8;
  HighsHashTree<int,_void>::
  for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:2004:7)_&,_0>
            ((NodePtr)(this->invertedHashListSizeTwo).
                      super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar15].root.ptrAndType,
             &local_90);
  pCVar11 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pCVar7 = (clique->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar14 = 0; ((ulong)((long)pCVar11 - (long)pCVar7) >> 2 & 0xffffffff) != uVar14;
      uVar14 = uVar14 + 1) {
    CVar3 = (clique->
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar14];
    (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))] = '\0';
  }
  local_78 = local_88 << 0x1e;
  lVar17 = local_78 >> 0x1e;
  uVar14 = 0;
  while( true ) {
    pCVar11 = (clique->
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pCVar7 = (clique->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar13 = (long)pCVar7 - (long)pCVar11 >> 2;
    iVar12 = (int)uVar13;
    if ((uVar8 == uVar14) || (iVar12 <= iVar10)) break;
    if (pCVar11[uVar14] != unaff_R13D) {
      HVar6 = shrinkToNeighbourhood
                        (this,(vector<int,_std::allocator<int>_> *)&local_68,
                         &this->numNeighbourhoodQueries,pCVar11[uVar14],
                         (CliqueVar *)(&pCVar11->field_0x0 + lVar17),iVar12 - iVar10);
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::erase
                (clique,(clique->
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        )._M_impl.super__Vector_impl_data._M_start + (HVar6 + iVar10),
                 (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    }
    uVar14 = uVar14 + 1;
  }
  if ((ulong)(local_78 >> 0x20) < uVar13) {
    HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
              (&this->randgen,pCVar11 + (local_78 >> 0x20),iVar12 - iVar10);
    uVar15 = (uint)(local_88 >> 2);
    lVar9 = (long)(int)uVar15;
    uVar15 = ~uVar15;
    lVar17 = lVar9 * 4;
    while( true ) {
      pCVar11 = (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pCVar7 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      iVar12 = (int)((ulong)((long)pCVar7 - (long)pCVar11) >> 2);
      if (iVar12 <= lVar9) break;
      HVar6 = shrinkToNeighbourhood
                        (this,(vector<int,_std::allocator<int>_> *)&local_68,
                         &this->numNeighbourhoodQueries,pCVar11[lVar9],
                         (CliqueVar *)(&pCVar11[1].field_0x0 + lVar17),iVar12 + uVar15);
      uVar15 = uVar15 - 1;
      lVar9 = lVar9 + 1;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::erase
                (clique,(CliqueVar *)
                        (&(clique->
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          )._M_impl.super__Vector_impl_data._M_start[(long)HVar6 + 1].field_0x0 +
                        lVar17),
                 (clique->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      lVar17 = lVar17 + 4;
    }
  }
  if ((char)local_7c == '\0') {
    runCliqueSubsumption(this,globaldomain,clique);
    __it._M_current =
         (clique->
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         )._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (clique->
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__it._M_current != __last._M_current) {
      lVar17 = (long)__last._M_current - (long)__it._M_current;
      local_90.addCands = (anon_class_24_3_c8bba91f *)globaldomain;
      local_70 = globaldomain;
      for (lVar9 = lVar17 >> 4; 0 < lVar9; lVar9 = lVar9 + -1) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                              *)&local_90,__it);
        __first._M_current = __it._M_current;
        if (bVar5) goto LAB_0027a1ba;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                              *)&local_90,__it._M_current + 1);
        __first._M_current = __it._M_current + 1;
        if (bVar5) goto LAB_0027a1ba;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                              *)&local_90,__it._M_current + 2);
        __first._M_current = __it._M_current + 2;
        if (bVar5) goto LAB_0027a1ba;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                              *)&local_90,__it._M_current + 3);
        __first._M_current = __it._M_current + 3;
        if (bVar5) goto LAB_0027a1ba;
        __it._M_current = __it._M_current + 4;
        lVar17 = lVar17 + -0x10;
      }
      lVar17 = lVar17 >> 2;
      if (lVar17 == 1) {
LAB_0027a24d:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                              *)&local_90,__it);
        __first._M_current = __it._M_current;
        if (!bVar5) {
          __first._M_current = __last._M_current;
        }
LAB_0027a1ba:
        if (__first._M_current != __last._M_current) {
          pCVar16 = __first._M_current;
          while (__first._M_current = __first._M_current + 1,
                __first._M_current != __last._M_current) {
            bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                    ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                                  *)&local_70,__first);
            if (!bVar5) {
              *pCVar16 = *__first._M_current;
              pCVar16 = pCVar16 + 1;
            }
          }
          __last._M_current =
               (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          __first._M_current = pCVar16;
        }
      }
      else {
        if (lVar17 == 2) {
LAB_0027a232:
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                  ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                                *)&local_90,__it);
          __first._M_current = __it._M_current;
          if (!bVar5) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0027a24d;
          }
          goto LAB_0027a1ba;
        }
        __first._M_current = __last._M_current;
        if (lVar17 == 3) {
          bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::$_3>
                  ::operator()((_Iter_pred<HighsCliqueTable::runCliqueMerging(HighsDomain&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,bool)::__3>
                                *)&local_90,__it);
          __first._M_current = __it._M_current;
          if (!bVar5) {
            __it._M_current = __it._M_current + 1;
            goto LAB_0027a232;
          }
          goto LAB_0027a1ba;
        }
      }
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::erase
                (clique,(const_iterator)__first._M_current,__last);
    }
  }
  else {
    for (lVar17 = (long)(int)(local_88 >> 2);
        lVar17 < (int)((ulong)((long)pCVar7 - (long)pCVar11) >> 2); lVar17 = lVar17 + 1) {
      vertexInfeasible(this,globaldomain,(uint)pCVar11[lVar17] & 0x7fffffff,
                       (uint)pCVar11[lVar17] >> 0x1f);
      pCVar11 = (clique->
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pCVar7 = (clique->
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  processInfeasibleVertices(this,globaldomain);
LAB_0027a215:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void HighsCliqueTable::runCliqueMerging(HighsDomain& globaldomain,
                                        std::vector<CliqueVar>& clique,
                                        bool equation) {
  CliqueVar extensionstart;
  HighsInt numcliques = kHighsIInf;
  iscandidate.resize(invertedHashList.size());
  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(invertedHashList.size());

  HighsInt initialCliqueSize = clique.size();
  for (HighsInt i = 0; i != initialCliqueSize; ++i) {
    if (globaldomain.isFixed(cliqueentries[i].col)) continue;

    HighsInt thisNumClqs = numCliques(clique[i]);
    if (thisNumClqs < numcliques) {
      numcliques = thisNumClqs;
      extensionstart = clique[i];
    }
  }

  if (numcliques == kHighsIInf) {
    clique.clear();
    return;
  }

  for (HighsInt i = 0; i != initialCliqueSize; ++i)
    iscandidate[clique[i].index()] = true;

  auto addCands = [&](HighsInt cliqueid) {
    HighsInt start = cliques[cliqueid].start;
    HighsInt end = cliques[cliqueid].end;

    for (HighsInt i = start; i != end; ++i) {
      if (iscandidate[cliqueentries[i].index()] ||
          globaldomain.isFixed(cliqueentries[i].col))
        continue;

      iscandidate[cliqueentries[i].index()] = true;
      clique.push_back(cliqueentries[i]);
    }
  };

  invertedHashList[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  invertedHashListSizeTwo[extensionstart.index()].for_each(
      [&](HighsInt cliqueid) { addCands(cliqueid); });

  HighsInt sizeWithCandidates = clique.size();
  for (HighsInt i = 0; i != sizeWithCandidates; ++i)
    iscandidate[clique[i].index()] = false;

  for (HighsInt i = 0;
       i != initialCliqueSize && initialCliqueSize < (HighsInt)clique.size();
       ++i) {
    if (clique[i] == extensionstart) continue;

    HighsInt newSize =
        initialCliqueSize +
        shrinkToNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries,
                              clique[i], clique.data() + initialCliqueSize,
                              clique.size() - initialCliqueSize);
    clique.erase(clique.begin() + newSize, clique.end());
  }

  if (static_cast<size_t>(initialCliqueSize) < clique.size()) {
    // todo, shuffle extension vars?
    randgen.shuffle(clique.data() + initialCliqueSize,
                    clique.size() - initialCliqueSize);
    HighsInt i = initialCliqueSize;
    while (i < (HighsInt)clique.size()) {
      CliqueVar extvar = clique[i];
      i += 1;

      HighsInt newSize = i + shrinkToNeighbourhood(
                                 neighbourhoodInds, numNeighbourhoodQueries,
                                 extvar, clique.data() + i, clique.size() - i);
      clique.erase(clique.begin() + newSize, clique.end());
    }
  }

  if (equation) {
    for (HighsInt i = initialCliqueSize; i < (HighsInt)clique.size(); ++i)
      vertexInfeasible(globaldomain, clique[i].col, clique[i].val);
  } else {
    runCliqueSubsumption(globaldomain, clique);

    if (!clique.empty()) {
      clique.erase(
          std::remove_if(clique.begin(), clique.end(),
                         [&](CliqueVar v) {
                           return globaldomain.isFixed(v.col) &&
                                  static_cast<int>(
                                      globaldomain.col_lower_[v.col]) ==
                                      static_cast<int>(1 - v.val);
                         }),
          clique.end());
    }
  }

  processInfeasibleVertices(globaldomain);
}